

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

size_t wallet::GetSerializeSizeForRecipient(CRecipient *recipient)

{
  size_t sVar1;
  long in_FS_OFFSET;
  CScriptBase in_stack_ffffffffffffff98;
  CTxOut local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&stack0xffffffffffffffa0,&recipient->dest);
  CTxOut::CTxOut(&local_40,&recipient->nAmount,(CScript)in_stack_ffffffffffffff98);
  sVar1 = GetSerializeSize<CTxOut>(&local_40);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&local_40.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetSerializeSizeForRecipient(const CRecipient& recipient)
{
    return ::GetSerializeSize(CTxOut(recipient.nAmount, GetScriptForDestination(recipient.dest)));
}